

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void __thiscall runtime::VirtualMachine::LoadClosure(VirtualMachine *this)

{
  element_type *peVar1;
  Function *fn;
  size_t index;
  Variable VVar2;
  Variable v;
  string local_40;
  
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    fn = peVar1->function;
    index = getByteCodeParameter(this);
    VVar2 = loadClosureValue(this,fn,index);
    v.field_1 = VVar2.field_1;
    v._4_4_ = 0;
    v.type = VVar2.type;
    pushOpStack(this,v);
    peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar1->programCounter = peVar1->programCounter + 1;
    return;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"No stack frame found in LoadClosure","");
  panic(this,&local_40);
}

Assistant:

void runtime::VirtualMachine::LoadClosure() {
  if (this->stackFrame == nullptr) {
    this->panic("No stack frame found in LoadClosure");
    return;
  }

  this->pushOpStack(
    this->loadClosureValue(this->stackFrame->function, this->getByteCodeParameter())
  );

  this->advance();
}